

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall
tetgenmesh::tetallnormal
          (tetgenmesh *this,point pa,point pb,point pc,point pd,double (*N) [3],double *volume)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  double (*padVar4) [3];
  int indx [4];
  double rhs [4];
  double D;
  double A [4] [4];
  
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    A[0][lVar2] = pa[lVar2] - pd[lVar2];
  }
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    A[1][lVar2] = pb[lVar2] - pd[lVar2];
  }
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    A[2][lVar2] = pc[lVar2] - pd[lVar2];
  }
  bVar1 = lu_decmp(this,A,3,indx,&D,0);
  if (bVar1) {
    if (volume != (double *)0x0) {
      *volume = ABS(A[indx[0]][0] * A[indx[1]][1] * A[indx[2]][2]) / 6.0;
    }
    padVar4 = N;
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
        rhs[lVar3] = 0.0;
      }
      rhs[lVar2] = 1.0;
      lu_solve(this,A,3,indx,rhs,0);
      for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
        (*padVar4)[lVar3] = rhs[lVar3];
      }
      padVar4 = padVar4 + 1;
    }
    for (lVar2 = -0x18; lVar2 != 0; lVar2 = lVar2 + 8) {
      *(double *)((long)N[4] + lVar2) =
           (-*(double *)((long)N[1] + lVar2) - *(double *)((long)N[2] + lVar2)) -
           *(double *)((long)N[3] + lVar2);
    }
  }
  else if (volume != (double *)0x0) {
    *volume = 0.0;
  }
  return;
}

Assistant:

void tetgenmesh::tetallnormal(point pa, point pb, point pc, point pd,
                              REAL N[4][3], REAL* volume)
{
  REAL A[4][4], rhs[4], D;
  int indx[4];
  int i, j;

  // get the entries of A[3][3].
  for (i = 0; i < 3; i++) A[0][i] = pa[i] - pd[i];  // d->a vec
  for (i = 0; i < 3; i++) A[1][i] = pb[i] - pd[i];  // d->b vec
  for (i = 0; i < 3; i++) A[2][i] = pc[i] - pd[i];  // d->c vec

  // Compute the inverse of matrix A, to get 3 normals of the 4 faces.
  if (lu_decmp(A, 3, indx, &D, 0)) { // Decompose the matrix just once.
    if (volume != NULL) {
      // Get the volume of the tet.
      *volume = fabs((A[indx[0]][0] * A[indx[1]][1] * A[indx[2]][2])) / 6.0;
    }
    for (j = 0; j < 3; j++) {
      for (i = 0; i < 3; i++) rhs[i] = 0.0;
      rhs[j] = 1.0;  // Positive means the inside direction
      lu_solve(A, 3, indx, rhs, 0);
      for (i = 0; i < 3; i++) N[j][i] = rhs[i];
    }
    // Get the fourth normal by summing up the first three.
    for (i = 0; i < 3; i++) N[3][i] = - N[0][i] - N[1][i] - N[2][i];
  } else {
    // The tet is degenerated.
    if (volume != NULL) {
      *volume = 0;
    }
  }
}